

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_delegate.cc
# Opt level: O2

void absl::lts_20250127::base_internal::ThrowStdDomainError(string *what_arg)

{
  domain_error *this;
  
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::domain_error::domain_error(this,(string *)what_arg);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

void ThrowStdDomainError(const std::string& what_arg) {
#ifdef ABSL_HAVE_EXCEPTIONS
  throw std::domain_error(what_arg);
#else
  ABSL_RAW_LOG(FATAL, "%s", what_arg.c_str());
  std::abort();
#endif
}